

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O0

size_t __thiscall
juzzlin::Argengine::Impl::processDefinitionMatch
          (Impl *this,OptionDefinitionSP *match,ArgumentVector *tokens,size_t currentIndex,
          bool dryRun)

{
  bool bVar1;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *pfVar2;
  const_reference pvVar3;
  element_type *peVar4;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  byte in_R8B;
  OptionDefinition *in_stack_00000008;
  Impl *in_stack_00000010;
  string *in_stack_00000020;
  Impl *in_stack_00000028;
  OptionDefinitionSP innerMatch;
  value_type value;
  size_type in_stack_ffffffffffffff48;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *this_00;
  string local_88 [48];
  __shared_ptr local_58 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::
  __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1365f2);
  bVar1 = std::function::operator_cast_to_bool((function<void_()> *)0x1365fe);
  if (bVar1) {
    if ((local_21 & 1) == 0) {
      std::
      __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x136618);
      std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffff50);
    }
    peVar4 = std::
             __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13662e);
    peVar4->applied = true;
  }
  else {
    std::
    __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x136641);
    bVar1 = std::function::operator_cast_to_bool(in_stack_ffffffffffffff50);
    if (bVar1) {
      this_00 = (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)((long)&(local_20->super__Function_base)._M_functor + 1);
      local_20 = this_00;
      pfVar2 = (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_18);
      if (pfVar2 <= this_00) {
        std::
        __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_ffffffffffffff50);
        throwNoValueError(in_stack_00000010,in_stack_00000008);
      }
      if ((local_21 & 1) == 0) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        __args = &local_48;
        std::__cxx11::string::string((string *)__args,(string *)pvVar3);
        getOptionDefinition(in_stack_00000028,in_stack_00000020);
        bVar1 = std::__shared_ptr::operator_cast_to_bool(local_58);
        if (bVar1) {
          std::
          __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator*((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_stack_ffffffffffffff50);
          throwNoValueError(in_stack_00000010,in_stack_00000008);
        }
        std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>::~shared_ptr
                  ((shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *)0x136738);
        std::__cxx11::string::~string((string *)&local_48);
        peVar4 = std::
                 __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x13674c);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffff50,(size_type)&peVar4->singleStringCallback);
        std::__cxx11::string::string(local_88,(string *)pvVar3);
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::operator()(this_00,__args);
        std::__cxx11::string::~string(local_88);
      }
      peVar4 = std::
               __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1367c7);
      peVar4->applied = true;
    }
  }
  return (size_t)local_20;
}

Assistant:

size_t processDefinitionMatch(OptionDefinitionSP match, const ArgumentVector & tokens, size_t currentIndex, bool dryRun) const
    {
        if (match->valuelessCallback) {
            if (!dryRun) {
                match->valuelessCallback();
            }
            match->applied = true;
        } else if (match->singleStringCallback) {
            if (++currentIndex < tokens.size()) {
                if (!dryRun) {
                    if (const auto value = tokens.at(currentIndex); const auto innerMatch = getOptionDefinition(value)) {
                        throwNoValueError(*match);
                    }
                    match->singleStringCallback(tokens.at(currentIndex));
                }
                match->applied = true;
            } else {
                throwNoValueError(*match);
            }
        }
        return currentIndex;
    }